

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool>
* __thiscall
pstore::json::details::
token_matcher<pstore::exchange::import_ns::callbacks,_pstore::json::details::false_complete>::
consume(pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool>
        *__return_storage_ptr__,
       token_matcher<pstore::exchange::import_ns::callbacks,_pstore::json::details::false_complete>
       *this,parser<pstore::exchange::import_ns::callbacks> *parser,maybe<char,_void> *ch)

{
  rule *prVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
  *puVar6;
  char *pcVar7;
  error_category *peVar8;
  error_category *extraout_RDX;
  bool bVar9;
  error_code err;
  error_code err_00;
  bool bVar10;
  
  iVar3 = (this->super_matcher<pstore::exchange::import_ns::callbacks>).state_;
  if (iVar3 == 2) {
    if (ch->valid_ == true) {
      pcVar7 = maybe<char,_void>::operator->(ch);
      pcVar5 = this->text_;
      if (*pcVar7 == *pcVar5) {
        this->text_ = pcVar5 + 1;
        bVar9 = true;
        if (pcVar5[1] != '\0') goto LAB_00131641;
        iVar3 = 3;
        bVar10 = true;
        goto LAB_0013163d;
      }
    }
LAB_0013161c:
    peVar8 = get_error_category();
    err_00._M_cat = peVar8;
    err_00._0_8_ = 0xb;
    bVar2 = parser<pstore::exchange::import_ns::callbacks>::set_error(parser,err_00);
    bVar9 = true;
    iVar3 = 1;
    bVar10 = true;
    if (!bVar2) goto LAB_00131641;
  }
  else {
    bVar10 = true;
    bVar9 = true;
    if (iVar3 != 3) {
      if (iVar3 == 1) {
        assert_failed("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                      ,0x1ad);
      }
      goto LAB_00131641;
    }
    if (ch->valid_ == true) {
      pcVar5 = maybe<char,_void>::operator->(ch);
      iVar3 = isalnum((int)*pcVar5);
      if (iVar3 != 0) goto LAB_0013161c;
      bVar10 = false;
    }
    puVar6 = exchange::import_ns::callbacks::top(&parser->callbacks_);
    prVar1 = (puVar6->_M_t).
             super___uniq_ptr_impl<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
             ._M_t.
             super__Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
             .super__Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false>._M_head_impl;
    uVar4 = (*prVar1->_vptr_rule[7])(prVar1,0);
    err._4_4_ = 0;
    err._M_value = uVar4;
    err._M_cat = extraout_RDX;
    parser<pstore::exchange::import_ns::callbacks>::set_error(parser,err);
    iVar3 = 1;
  }
LAB_0013163d:
  bVar9 = bVar10;
  (this->super_matcher<pstore::exchange::import_ns::callbacks>).state_ = iVar3;
LAB_00131641:
  *(undefined8 *)
   &(__return_storage_ptr__->first)._M_t.
    super___uniq_ptr_impl<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
       = 1;
  (__return_storage_ptr__->first)._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
  .
  super__Head_base<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_false>
  ._M_head_impl = (matcher<pstore::exchange::import_ns::callbacks> *)0x0;
  __return_storage_ptr__->second = bVar9;
  return __return_storage_ptr__;
}

Assistant:

std::pair<typename matcher<Callbacks>::pointer, bool>
            token_matcher<Callbacks, DoneFunction>::consume (parser<Callbacks> & parser,
                                                             maybe<char> ch) {
                bool match = true;
                switch (this->get_state ()) {
                case start_state:
                    if (!ch || *ch != *text_) {
                        this->set_error (parser, error_code::unrecognized_token);
                    } else {
                        ++text_;
                        if (*text_ == '\0') {
                            // We've run out of input text, so ensure that the next character isn't
                            // alpha-numeric.
                            this->set_state (last_state);
                        }
                    }
                    break;
                case last_state:
                    if (ch) {
                        if (std::isalnum (*ch) != 0) {
                            this->set_error (parser, error_code::unrecognized_token);
                            return {nullptr, true};
                        }
                        match = false;
                    }
                    this->set_error (parser, done_ (parser));
                    this->set_state (done_state);
                    break;
                case done_state: PSTORE_ASSERT (false); break;
                }
                return {nullptr, match};
            }